

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sequence_info.cpp
# Opt level: O0

void __thiscall duckdb::CreateSequenceInfo::CreateSequenceInfo(CreateSequenceInfo *this)

{
  long lVar1;
  undefined8 *in_RDI;
  allocator local_61;
  string local_60 [40];
  string *in_stack_ffffffffffffffc8;
  string *in_stack_ffffffffffffffd0;
  string local_28 [7];
  CatalogType in_stack_ffffffffffffffdf;
  CreateInfo *in_stack_ffffffffffffffe0;
  
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            (local_28,anon_var_dwarf_3eb64fd + 9,(allocator *)&stack0xffffffffffffffd7);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_60,anon_var_dwarf_3eb64fd + 9,&local_61);
  CreateInfo::CreateInfo
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffc8);
  ::std::__cxx11::string::~string(local_60);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_61);
  ::std::__cxx11::string::~string(local_28);
  ::std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd7);
  *in_RDI = &PTR__CreateSequenceInfo_0351b210;
  ::std::__cxx11::string::string((string *)(in_RDI + 0x25));
  in_RDI[0x29] = 0;
  in_RDI[0x2a] = 1;
  in_RDI[0x2b] = 1;
  lVar1 = NumericLimits<long>::Maximum();
  in_RDI[0x2c] = lVar1;
  in_RDI[0x2d] = 1;
  *(undefined1 *)(in_RDI + 0x2e) = 0;
  return;
}

Assistant:

CreateSequenceInfo::CreateSequenceInfo()
    : CreateInfo(CatalogType::SEQUENCE_ENTRY, INVALID_SCHEMA), name(string()), usage_count(0), increment(1),
      min_value(1), max_value(NumericLimits<int64_t>::Maximum()), start_value(1), cycle(false) {
}